

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-list.c
# Opt level: O0

object_list_t * object_list_new(void)

{
  object_list_entry_t *poVar1;
  size_t size;
  object_list_t *list;
  
  list = (object_list_t *)mem_zalloc(0x28);
  if (list == (object_list_t *)0x0) {
    list = (object_list_t *)0x0;
  }
  else {
    poVar1 = (object_list_entry_t *)mem_zalloc(0xa000);
    list->entries = poVar1;
    if (list->entries == (object_list_entry_t *)0x0) {
      mem_free(list);
      list = (object_list_t *)0x0;
    }
    else {
      list->entries_size = 0xa00;
    }
  }
  return list;
}

Assistant:

object_list_t *object_list_new(void)
{
	object_list_t *list = mem_zalloc(sizeof(object_list_t));
	size_t size = MAX_ITEMLIST;

	if (list == NULL)
		return NULL;

	list->entries = mem_zalloc(size * sizeof(object_list_entry_t));

	if (list->entries == NULL) {
		mem_free(list);
		return NULL;
	}

	list->entries_size = size;

	return list;
}